

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void insert(upb_table *t,lookupkey_t key,upb_key tabkey,upb_value val,uint32_t hash,
           hashfunc_t *hashfunc,eqlfunc_t *eql)

{
  _upb_tabent *p_Var1;
  upb_key uVar2;
  upb_tabent *puVar3;
  _Bool _Var4;
  uint32_t uVar5;
  ulong uVar6;
  upb_tabent *puVar7;
  uint uVar8;
  upb_tabent *puVar9;
  upb_tabent *puVar10;
  upb_tabent *puVar11;
  
  if (t->count != 0) {
    uVar8 = t->mask & hash;
    if (t->entries[uVar8].key.num != 0) {
      puVar7 = t->entries + uVar8;
      do {
        _Var4 = (*eql)(puVar7->key,key);
        if (_Var4) goto LAB_00291833;
        puVar7 = puVar7->next;
      } while (puVar7 != (_upb_tabent *)0x0);
      puVar7 = (upb_tabent *)0x0;
LAB_00291833:
      if (puVar7 != (upb_tabent *)0x0) {
        __assert_fail("findentry(t, key, hash, eql) == ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                      ,0xbb,
                      "void insert(upb_table *, lookupkey_t, upb_key, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                     );
      }
    }
  }
  t->count = t->count + 1;
  puVar7 = t->entries;
  uVar6 = (ulong)(t->mask & hash);
  puVar11 = puVar7 + uVar6;
  if ((puVar11->key).num != 0) {
    uVar8 = t->mask + 1;
    puVar9 = puVar7 + uVar8;
    puVar3 = puVar7 + uVar6 + 1;
    while (puVar10 = puVar3, puVar10 < puVar9) {
      puVar3 = puVar10 + 1;
      if ((puVar10->key).num == 0) goto LAB_002918b1;
    }
    if (uVar8 == 0) goto LAB_00291933;
    while (puVar10 = puVar7, (puVar7->key).num != 0) {
      puVar7 = puVar7 + 1;
      if (puVar9 <= puVar7) {
LAB_00291933:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                      ,0x90,"upb_tabent *emptyent(upb_table *, upb_tabent *)");
      }
    }
LAB_002918b1:
    uVar5 = (*hashfunc)(puVar11->key);
    uVar8 = t->mask;
    puVar7 = t->entries;
    if (puVar7 + (uVar5 & uVar8) == puVar11) {
      puVar10->next = puVar11->next;
      puVar11->next = puVar10;
      goto LAB_00291965;
    }
    puVar10->next = puVar11->next;
    uVar2 = puVar11->key;
    (puVar10->val).val = (puVar11->val).val;
    puVar10->key = uVar2;
    puVar7 = puVar7 + (uVar5 & uVar8);
    while (p_Var1 = puVar7->next, p_Var1 != puVar11) {
      puVar7 = p_Var1;
      if (p_Var1 == (_upb_tabent *)0x0) {
        __assert_fail("chain",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                      ,0xd7,
                      "void insert(upb_table *, lookupkey_t, upb_key, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                     );
      }
    }
    puVar7->next = puVar10;
  }
  puVar11->next = (_upb_tabent *)0x0;
  puVar10 = puVar11;
LAB_00291965:
  puVar10->key = tabkey;
  (puVar10->val).val = val.val;
  if (t->count != 0) {
    uVar8 = hash & t->mask;
    if (t->entries[uVar8].key.num != 0) {
      puVar7 = t->entries + uVar8;
      do {
        _Var4 = (*eql)(puVar7->key,key);
        if (_Var4) goto LAB_002919b6;
        puVar7 = puVar7->next;
      } while (puVar7 != (_upb_tabent *)0x0);
    }
  }
  puVar7 = (upb_tabent *)0x0;
LAB_002919b6:
  if (puVar7 != puVar10) {
    __assert_fail("findentry(t, key, hash, eql) == our_e",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                  ,0xe0,
                  "void insert(upb_table *, lookupkey_t, upb_key, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                 );
  }
  return;
}

Assistant:

static void insert(upb_table* t, lookupkey_t key, upb_key tabkey, upb_value val,
                   uint32_t hash, hashfunc_t* hashfunc, eqlfunc_t* eql) {
  upb_tabent* mainpos_e;
  upb_tabent* our_e;

  UPB_ASSERT(findentry(t, key, hash, eql) == NULL);

  t->count++;
  mainpos_e = getentry_mutable(t, hash);
  our_e = mainpos_e;

  if (upb_tabent_isempty(mainpos_e)) {
    /* Our main position is empty; use it. */
    our_e->next = NULL;
  } else {
    /* Collision. */
    upb_tabent* new_e = emptyent(t, mainpos_e);
    /* Head of collider's chain. */
    upb_tabent* chain = getentry_mutable(t, hashfunc(mainpos_e->key));
    if (chain == mainpos_e) {
      /* Existing ent is in its main position (it has the same hash as us, and
       * is the head of our chain).  Insert to new ent and append to this chain.
       */
      new_e->next = mainpos_e->next;
      mainpos_e->next = new_e;
      our_e = new_e;
    } else {
      /* Existing ent is not in its main position (it is a node in some other
       * chain).  This implies that no existing ent in the table has our hash.
       * Evict it (updating its chain) and use its ent for head of our chain. */
      *new_e = *mainpos_e; /* copies next. */
      while (chain->next != mainpos_e) {
        chain = (upb_tabent*)chain->next;
        UPB_ASSERT(chain);
      }
      chain->next = new_e;
      our_e = mainpos_e;
      our_e->next = NULL;
    }
  }
  our_e->key = tabkey;
  our_e->val = val;
  UPB_ASSERT(findentry(t, key, hash, eql) == our_e);
}